

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gb18030.c
# Opt level: O2

int gb18030_code_to_mbclen(OnigCodePoint code)

{
  if (code < 0x1000000) {
    if (0xffff < code) {
      return -400;
    }
    if (code < 0x100) {
      if (0x7d < (ulong)code - 0x81) {
        return 1;
      }
    }
    else if ((ulong)(code >> 8) - 0x81 < 0x7e) {
      if (0xffffffffffffff81 < ((ulong)code & 0xff) - 0xff) {
        return 2;
      }
      if (""[(ulong)code & 0xff] == '\x01') {
        return 2;
      }
    }
  }
  else if (((ulong)(code >> 0x18) - 0x81 < 0x7e) && ((ulong)(code >> 0x10 & 0xfe) - 0x30 < 10)) {
    return 4;
  }
  return -400;
}

Assistant:

static int
gb18030_code_to_mbclen(OnigCodePoint code)
{
  if ((code & 0xff000000) != 0) {
    if (GB18030_MAP[(int )(code >> 24) & 0xff] == CM)
      if (GB18030_MAP[(int )(code >> 16) & 0xff] == C4)
        return 4;
  }
  else if ((code & 0xff0000) != 0) return ONIGERR_INVALID_CODE_POINT_VALUE;
  else if ((code & 0xff00) != 0) {
    if (GB18030_MAP[(int )(code >> 8) & 0xff] == CM) {
      char c = GB18030_MAP[(int )code & 0xff];
      if (c == CM || c == C2)
        return 2;
    }
  }
  else {
    if (GB18030_MAP[(int )(code & 0xff)] != CM)
      return 1;
  }

  return ONIGERR_INVALID_CODE_POINT_VALUE;
}